

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreEvaluators.h
# Opt level: O0

CoeffReturnType __thiscall
Eigen::internal::
binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
::coeff(binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
        *this,Index index)

{
  result_type rVar1;
  CoeffReturnType local_28;
  CoeffReturnType local_20;
  Index local_18;
  Index index_local;
  binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  *this_local;
  
  local_18 = index;
  index_local = (Index)this;
  local_20 = binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
             ::coeff((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::CwiseUnaryOp<Eigen::internal::scalar_sqrt_op<double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                      *)&this->m_lhsImpl,index);
  local_28 = binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,_-1,_-1,_0,_-1,_-1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
             ::coeff((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::ArrayWrapper<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Array<double,__1,__1,_0,__1,__1>_>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
                      *)&this->m_rhsImpl,local_18);
  rVar1 = scalar_sum_op<double,_double>::operator()
                    ((scalar_sum_op<double,_double> *)this,&local_20,&local_28);
  return rVar1;
}

Assistant:

CoeffReturnType coeff(Index index) const
  {
    return m_functor(m_lhsImpl.coeff(index), m_rhsImpl.coeff(index));
  }